

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,StringTree *params_3,
          ArrayPtr<const_char> *params_4,CappedArray<char,_14UL> *params_5,
          ArrayPtr<const_char> *params_6,StringTree *params_7,ArrayPtr<const_char> *params_8,
          StringTree *params_9,ArrayPtr<const_char> *params_10,StringTree *params_11,
          ArrayPtr<const_char> *params_12,StringTree *params_13,ArrayPtr<const_char> *params_14,
          ArrayPtr<const_char> *params_15,StringTree *params_16,ArrayPtr<const_char> *params_17,
          ArrayPtr<const_char> *params_18,StringTree *params_19,StringTree *params_20,
          ArrayPtr<const_char> *params_21)

{
  size_t sVar1;
  ArrayPtr<const_char> *pAVar2;
  StringTree *pSVar3;
  CappedArray<char,_14UL> *pCVar4;
  char *pos;
  ArrayPtr<const_char> *rest;
  ArrayPtr<const_char> *rest_1;
  ArrayPtr<const_char> *rest_3;
  ArrayPtr<const_char> *rest_5;
  StringTree *rest_6;
  ArrayPtr<const_char> *rest_7;
  StringTree *rest_8;
  ArrayPtr<const_char> *rest_9;
  StringTree *rest_10;
  ArrayPtr<const_char> *rest_11;
  StringTree *rest_12;
  ArrayPtr<const_char> *rest_13;
  ArrayPtr<const_char> *rest_14;
  StringTree *rest_15;
  ArrayPtr<const_char> *rest_16;
  ArrayPtr<const_char> *rest_17;
  StringTree *rest_18;
  StringTree *rest_19;
  ArrayPtr<const_char> *rest_20;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  size_t local_2c0;
  size_t local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  size_t local_2a0;
  size_t local_298;
  size_t local_290;
  size_t local_288;
  size_t local_280;
  size_t local_278;
  size_t local_270;
  size_t local_268;
  size_t local_260;
  size_t local_258;
  size_t local_250;
  size_t local_248;
  size_t local_240;
  _ *local_238;
  undefined8 local_230;
  Array<kj::StringTree::Branch> local_228;
  size_t local_210;
  size_t local_208;
  size_t local_200;
  size_t local_1f8;
  size_t local_1f0;
  size_t local_1e8;
  size_t local_1e0;
  size_t local_1d8;
  size_t local_1d0;
  size_t local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  size_t local_1a0;
  size_t local_198;
  size_t local_190;
  size_t local_188;
  size_t local_180;
  size_t local_178;
  size_t local_170;
  size_t local_168;
  _ *local_160;
  undefined8 local_158;
  String local_150;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  _ *local_78;
  undefined8 local_70;
  undefined1 local_61;
  StringTree *local_60;
  ArrayPtr<const_char> *params_local_4;
  StringTree *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  ArrayPtr<const_char> *params_local;
  StringTree *result;
  
  local_61 = 0;
  local_60 = params_3;
  params_local_4 = params_2;
  params_local_3 = (StringTree *)params_1;
  params_local_2 = params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_128 = ArrayPtr<const_char>::size(params_local_1);
  local_120 = ArrayPtr<const_char>::size(params_local_2);
  local_118 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_3);
  local_110 = size((StringTree *)params_local_4);
  local_108 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_60);
  local_100 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_4);
  local_f8 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_5);
  local_f0 = size((StringTree *)params_6);
  local_e8 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_7);
  local_e0 = size((StringTree *)params_8);
  local_d8 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_9);
  local_d0 = size((StringTree *)params_10);
  local_c8 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_11);
  local_c0 = size((StringTree *)params_12);
  local_b8 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_13);
  local_b0 = ArrayPtr<const_char>::size(params_14);
  local_a8 = size((StringTree *)params_15);
  local_a0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_16);
  local_98 = ArrayPtr<const_char>::size(params_17);
  local_90 = size((StringTree *)params_18);
  local_88 = size(params_19);
  local_80 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_20);
  local_78 = (_ *)&local_128;
  local_70 = 0x16;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x16;
  sVar1 = _::sum(local_78,nums);
  __return_storage_ptr__->size_ = sVar1;
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_210 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  local_208 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_3);
  local_200 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_4);
  local_1f8 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)local_60);
  local_1f0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_4);
  local_1e8 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_5);
  local_1e0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_6);
  local_1d8 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_7);
  local_1d0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_8);
  local_1c8 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_9);
  local_1c0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_10);
  local_1b8 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_11);
  local_1b0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_12);
  local_1a8 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_13);
  local_1a0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_14);
  local_198 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_15);
  local_190 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_16);
  local_188 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_17);
  local_180 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_18);
  local_178 = flatSize(pSVar3);
  pSVar3 = fwd<kj::StringTree>(params_19);
  local_170 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_20);
  local_168 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  local_160 = (_ *)&local_210;
  local_158 = 0x16;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x16;
  sVar1 = _::sum(local_160,nums_00);
  heapString(&local_150,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_150);
  String::~String(&local_150);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_2e8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  local_2e0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_3);
  local_2d8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_4);
  local_2d0 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)local_60);
  local_2c8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_4);
  local_2c0 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_5);
  local_2b8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_6);
  local_2b0 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_7);
  local_2a8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_8);
  local_2a0 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_9);
  local_298 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_10);
  local_290 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_11);
  local_288 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_12);
  local_280 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_13);
  local_278 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_14);
  local_270 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_15);
  local_268 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_16);
  local_260 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_17);
  local_258 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_18);
  local_250 = branchCount(pSVar3);
  pSVar3 = fwd<kj::StringTree>(params_19);
  local_248 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_20);
  local_240 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  local_238 = (_ *)&local_2e8;
  local_230 = 0x16;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x16;
  sVar1 = _::sum(local_238,nums_01);
  heapArray<kj::StringTree::Branch>(&local_228,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_228);
  Array<kj::StringTree::Branch>::~Array(&local_228);
  pos = String::begin(&__return_storage_ptr__->text);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  rest = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  rest_1 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_3);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_4);
  rest_3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)local_60);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_4);
  rest_5 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_5);
  rest_6 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_6);
  rest_7 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_7);
  rest_8 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_8);
  rest_9 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_9);
  rest_10 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_10);
  rest_11 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_11);
  rest_12 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_12);
  rest_13 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_13);
  rest_14 = fwd<kj::ArrayPtr<char_const>>(params_14);
  rest_15 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_15);
  rest_16 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_16);
  rest_17 = fwd<kj::ArrayPtr<char_const>>(params_17);
  rest_18 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_18);
  rest_19 = fwd<kj::StringTree>(params_19);
  rest_20 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_20);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,pAVar2,rest,rest_1,pSVar3,rest_3,pCVar4,rest_5,rest_6,
             rest_7,rest_8,rest_9,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,
             rest_18,rest_19,rest_20);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}